

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O1

void ggml_opt_result_loss(ggml_opt_result_t result,double *loss,double *unc)

{
  bool bVar1;
  float *pfVar2;
  long lVar3;
  iterator __begin1;
  float *pfVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  pfVar4 = (result->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (result->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pfVar2 - (long)pfVar4;
  if (lVar3 == 0) {
    *loss = 0.0;
  }
  else {
    lVar3 = lVar3 >> 2;
    dVar5 = 0.0;
    dVar6 = 0.0;
    do {
      fVar7 = *pfVar4;
      if (result->loss_per_datapoint != false) {
        fVar7 = fVar7 * (float)result->opt_period;
      }
      dVar5 = dVar5 + (double)fVar7;
      dVar6 = dVar6 + (double)(fVar7 * fVar7);
      pfVar4 = pfVar4 + 1;
    } while (pfVar4 != pfVar2);
    dVar8 = (double)lVar3;
    dVar9 = dVar5 / dVar8;
    bVar1 = result->loss_per_datapoint;
    dVar10 = dVar9;
    if (bVar1 == false) {
      dVar10 = dVar5;
    }
    *loss = dVar10;
    if (unc == (double *)0x0) {
      return;
    }
    if (1 < lVar3) {
      dVar5 = dVar6 / dVar8 - dVar9 * dVar9;
      if (bVar1 == false) {
        dVar5 = dVar5 * dVar8;
      }
      dVar5 = dVar5 / (double)(lVar3 + -1);
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      goto LAB_00129f06;
    }
  }
  dVar5 = NAN;
LAB_00129f06:
  *unc = dVar5;
  return;
}

Assistant:

void ggml_opt_result_loss(ggml_opt_result_t result, double * loss, double * unc) {
    const int64_t nbatches = result->loss.size(); // Number of physical batches.

    if (nbatches == 0) {
        *loss = 0.0;
        *unc  = NAN;
        return;
    }

    double sum         = 0.0;
    double sum_squared = 0.0;

    for (const float & loss : result->loss) {
        // If the loss is per datapoint it was scaled by 1.0f/opt_period for each physical batch.
        const float loss_scaled = result->loss_per_datapoint ? loss*result->opt_period : loss;
        sum         += loss_scaled;
        sum_squared += loss_scaled*loss_scaled;
    }

    const double mean = sum/nbatches;
    *loss = result->loss_per_datapoint ? mean : sum;

    if (!unc) {
        return;
    }

    if (nbatches < 2) {
        *unc = NAN;
        return;
    }

    const double var_sum = sum_squared/nbatches - mean*mean; // variance without Bessel's correction, i.e. nbatches/(nbatches-1)
    *unc = result->loss_per_datapoint ? sqrt(var_sum / (nbatches - 1)) : sqrt(var_sum * nbatches/(nbatches - 1));
}